

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::Flush
          (ProducerEndpointImpl *this,FlushRequestID flush_request_id,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *data_sources)

{
  TaskRunner *pTVar1;
  anon_class_48_3_df81595a local_80;
  function<void_()> local_50;
  undefined1 local_30 [8];
  WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> weak_this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *data_sources_local;
  FlushRequestID flush_request_id_local;
  ProducerEndpointImpl *this_local;
  
  weak_this.handle_.
  super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data_sources;
  perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ProducerEndpointImpl>::GetWeakPtr
            ((WeakPtrFactory<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_30);
  pTVar1 = this->task_runner_;
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl>::WeakPtr
            (&local_80.weak_this,
             (WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_30);
  local_80.flush_request_id = flush_request_id;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_80.data_sources,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             weak_this.handle_.
             super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  ::std::function<void()>::
  function<perfetto::TracingServiceImpl::ProducerEndpointImpl::Flush(unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::__0,void>
            ((function<void()> *)&local_50,&local_80);
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1,&local_50);
  ::std::function<void_()>::~function(&local_50);
  Flush(unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::$_0::~__0
            ((__0 *)&local_80);
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl>::~WeakPtr
            ((WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_30);
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::Flush(
    FlushRequestID flush_request_id,
    const std::vector<DataSourceInstanceID>& data_sources) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, flush_request_id, data_sources] {
    if (weak_this) {
      weak_this->producer_->Flush(flush_request_id, data_sources.data(),
                                  data_sources.size());
    }
  });
}